

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t check_symlinks_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  int fd;
  int iVar1;
  int *piVar2;
  wchar_t *pwVar3;
  bool bVar4;
  undefined1 local_e0 [4];
  wchar_t restore_pwd;
  stat_conflict st;
  char local_45;
  wchar_t r;
  char c;
  char *pcStack_40;
  wchar_t last;
  char *head;
  char *tail;
  wchar_t res;
  wchar_t flags_local;
  archive_string *a_estr_local;
  wchar_t *a_eno_local;
  char *path_local;
  
  tail._0_4_ = L'\0';
  if (*path == '\0') {
    path_local._4_4_ = L'\0';
  }
  else {
    fd = open(".",0x80000);
    __archive_ensure_cloexec_flag(fd);
    if (fd < 0) {
      path_local._4_4_ = L'\xffffffe2';
    }
    else {
      bVar4 = false;
      pcStack_40 = path;
      head = path;
      if (*path == '/') {
        head = path + 1;
      }
      while (!bVar4) {
        for (; *head == '/'; head = head + 1) {
        }
        while( true ) {
          bVar4 = false;
          if (*head != '\0') {
            bVar4 = *head != '/';
          }
          if (!bVar4) break;
          head = head + 1;
        }
        bVar4 = true;
        if ((*head != '\0') && (bVar4 = false, *head == '/')) {
          bVar4 = head[1] == '\0';
        }
        local_45 = *head;
        *head = '\0';
        st.__glibc_reserved[2]._4_4_ = lstat(pcStack_40,(stat *)local_e0);
        if (st.__glibc_reserved[2]._4_4_ != 0) {
          *head = local_45;
          piVar2 = __errno_location();
          if (*piVar2 != 2) {
            pwVar3 = __errno_location();
            fsobj_error(a_eno,a_estr,*pwVar3,"Could not stat ",path);
            tail._0_4_ = L'\xffffffe7';
          }
          break;
        }
        if (((uint)st.st_nlink & 0xf000) == 0x4000) {
          if (!bVar4) {
            iVar1 = chdir(pcStack_40);
            if (iVar1 != 0) {
              *head = local_45;
              pwVar3 = __errno_location();
              fsobj_error(a_eno,a_estr,*pwVar3,"Could not chdir ",path);
              tail._0_4_ = L'\xffffffe2';
              break;
            }
            pcStack_40 = head + 1;
          }
        }
        else if (((uint)st.st_nlink & 0xf000) == 0xa000) {
          if (bVar4) {
            iVar1 = unlink(pcStack_40);
            if (iVar1 == 0) {
              *head = local_45;
              tail._0_4_ = L'\0';
            }
            else {
              *head = local_45;
              pwVar3 = __errno_location();
              fsobj_error(a_eno,a_estr,*pwVar3,"Could not remove symlink ",path);
              tail._0_4_ = L'\xffffffe7';
            }
            break;
          }
          if ((flags & 0x10U) == 0) {
            if ((flags & 0x100U) != 0) {
              *head = local_45;
              fsobj_error(a_eno,a_estr,L'\0',"Cannot extract through symlink ",path);
              tail._0_4_ = L'\xffffffe7';
              break;
            }
            st.__glibc_reserved[2]._4_4_ = stat(pcStack_40,(stat *)local_e0);
            if (st.__glibc_reserved[2]._4_4_ != 0) {
              *head = local_45;
              piVar2 = __errno_location();
              if (*piVar2 != 2) {
                pwVar3 = __errno_location();
                fsobj_error(a_eno,a_estr,*pwVar3,"Could not stat ",path);
                tail._0_4_ = L'\xffffffe7';
              }
              break;
            }
            if (((uint)st.st_nlink & 0xf000) != 0x4000) {
              *head = local_45;
              fsobj_error(a_eno,a_estr,L'\0',"Cannot extract through symlink ",path);
              tail._0_4_ = L'\xffffffe7';
              break;
            }
            iVar1 = chdir(pcStack_40);
            if (iVar1 != 0) {
              *head = local_45;
              pwVar3 = __errno_location();
              fsobj_error(a_eno,a_estr,*pwVar3,"Could not chdir ",path);
              tail._0_4_ = L'\xffffffe2';
              break;
            }
            pcStack_40 = head + 1;
          }
          else {
            iVar1 = unlink(pcStack_40);
            if (iVar1 != 0) {
              *head = local_45;
              fsobj_error(a_eno,a_estr,L'\0',"Cannot remove intervening symlink ",path);
              tail._0_4_ = L'\xffffffe7';
              break;
            }
            *head = local_45;
          }
        }
        *head = local_45;
        if (*head != '\0') {
          head = head + 1;
        }
      }
      *head = local_45;
      if (-1 < fd) {
        st.__glibc_reserved[2]._4_4_ = fchdir(fd);
        if (st.__glibc_reserved[2]._4_4_ != 0) {
          pwVar3 = __errno_location();
          fsobj_error(a_eno,a_estr,*pwVar3,"chdir() failure","");
        }
        close(fd);
        if (st.__glibc_reserved[2]._4_4_ != 0) {
          tail._0_4_ = L'\xffffffe2';
        }
      }
      path_local._4_4_ = (wchar_t)tail;
    }
  }
  return path_local._4_4_;
}

Assistant:

static int
check_symlinks_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
#if !defined(HAVE_LSTAT)
	/* Platform doesn't have lstat, so we can't look for symlinks. */
	(void)path; /* UNUSED */
	(void)error_number; /* UNUSED */
	(void)error_string; /* UNUSED */
	(void)flags; /* UNUSED */
	return (ARCHIVE_OK);
#else
	int res = ARCHIVE_OK;
	char *tail;
	char *head;
	int last;
	char c;
	int r;
	struct stat st;
	int restore_pwd;

	/* Nothing to do here if name is empty */
	if(path[0] == '\0')
	    return (ARCHIVE_OK);

	/*
	 * Guard against symlink tricks.  Reject any archive entry whose
	 * destination would be altered by a symlink.
	 *
	 * Walk the filename in chunks separated by '/'.  For each segment:
	 *  - if it doesn't exist, continue
	 *  - if it's symlink, abort or remove it
	 *  - if it's a directory and it's not the last chunk, cd into it
	 * As we go:
	 *  head points to the current (relative) path
	 *  tail points to the temporary \0 terminating the segment we're
	 *      currently examining
	 *  c holds what used to be in *tail
	 *  last is 1 if this is the last tail
	 */
	restore_pwd = open(".", O_RDONLY | O_BINARY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(restore_pwd);
	if (restore_pwd < 0)
		return (ARCHIVE_FATAL);
	head = path;
	tail = path;
	last = 0;
	/* TODO: reintroduce a safe cache here? */
	/* Skip the root directory if the path is absolute. */
	if(tail == path && tail[0] == '/')
		++tail;
	/* Keep going until we've checked the entire name.
	 * head, tail, path all alias the same string, which is
	 * temporarily zeroed at tail, so be careful restoring the
	 * stashed (c=tail[0]) for error messages.
	 * Exiting the loop with break is okay; continue is not.
	 */
	while (!last) {
		/*
		 * Skip the separator we just consumed, plus any adjacent ones
		 */
		while (*tail == '/')
		    ++tail;
		/* Skip the next path element. */
		while (*tail != '\0' && *tail != '/')
			++tail;
		/* is this the last path component? */
		last = (tail[0] == '\0') || (tail[0] == '/' && tail[1] == '\0');
		/* temporarily truncate the string here */
		c = tail[0];
		tail[0] = '\0';
		/* Check that we haven't hit a symlink. */
		r = lstat(head, &st);
		if (r != 0) {
			tail[0] = c;
			/* We've hit a dir that doesn't exist; stop now. */
			if (errno == ENOENT) {
				break;
			} else {
				/*
				 * Treat any other error as fatal - best to be
				 * paranoid here.
				 * Note: This effectively disables deep
				 * directory support when security checks are
				 * enabled. Otherwise, very long pathnames that
				 * trigger an error here could evade the
				 * sandbox.
				 * TODO: We could do better, but it would
				 * probably require merging the symlink checks
				 * with the deep-directory editing.
				 */
				fsobj_error(a_eno, a_estr, errno,
				    "Could not stat ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		} else if (S_ISDIR(st.st_mode)) {
			if (!last) {
				if (chdir(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not chdir ", path);
					res = (ARCHIVE_FATAL);
					break;
				}
				/* Our view is now from inside this dir: */
				head = tail + 1;
			}
		} else if (S_ISLNK(st.st_mode)) {
			if (last) {
				/*
				 * Last element is symlink; remove it
				 * so we can overwrite it with the
				 * item being extracted.
				 */
				if (unlink(head)) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not remove symlink ",
					    path);
					res = ARCHIVE_FAILED;
					break;
				}
				/*
				 * Even if we did remove it, a warning
				 * is in order.  The warning is silly,
				 * though, if we're just replacing one
				 * symlink with another symlink.
				 */
				tail[0] = c;
				/*
				 * FIXME:  not sure how important this is to
				 * restore
				 */
				/*
				if (!S_ISLNK(path)) {
					fsobj_error(a_eno, a_estr, 0,
					    "Removing symlink ", path);
				}
				*/
				/* Symlink gone.  No more problem! */
				res = ARCHIVE_OK;
				break;
			} else if (flags & ARCHIVE_EXTRACT_UNLINK) {
				/* User asked us to remove problems. */
				if (unlink(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot remove intervening "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
				tail[0] = c;
			} else if ((flags &
			    ARCHIVE_EXTRACT_SECURE_SYMLINKS) == 0) {
				/*
				 * We are not the last element and we want to
				 * follow symlinks if they are a directory.
				 * 
				 * This is needed to extract hardlinks over
				 * symlinks.
				 */
				r = stat(head, &st);
				if (r != 0) {
					tail[0] = c;
					if (errno == ENOENT) {
						break;
					} else {
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not stat ", path);
						res = (ARCHIVE_FAILED);
						break;
					}
				} else if (S_ISDIR(st.st_mode)) {
					if (chdir(head) != 0) {
						tail[0] = c;
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not chdir ", path);
						res = (ARCHIVE_FATAL);
						break;
					}
					/*
					 * Our view is now from inside
					 * this dir:
					 */
					head = tail + 1;
				} else {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot extract through "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
			} else {
				tail[0] = c;
				fsobj_error(a_eno, a_estr, 0,
				    "Cannot extract through symlink ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		}
		/* be sure to always maintain this */
		tail[0] = c;
		if (tail[0] != '\0')
			tail++; /* Advance to the next segment. */
	}
	/* Catches loop exits via break */
	tail[0] = c;
#ifdef HAVE_FCHDIR
	/* If we changed directory above, restore it here. */
	if (restore_pwd >= 0) {
		r = fchdir(restore_pwd);
		if (r != 0) {
			fsobj_error(a_eno, a_estr, errno,
			    "chdir() failure", "");
		}
		close(restore_pwd);
		restore_pwd = -1;
		if (r != 0) {
			res = (ARCHIVE_FATAL);
		}
	}
#endif
	/* TODO: reintroduce a safe cache here? */
	return res;
#endif
}